

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,DescriptorProto *message,LocationRecorder *parent_location)

{
  bool bVar1;
  bool bVar2;
  DescriptorProto_ReservedRange *pDVar3;
  char *error;
  int iVar4;
  Parser *this_00;
  int iVar5;
  int local_c0;
  int start;
  Parser *local_b8;
  LocationRecorder *local_b0;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *local_a8;
  DescriptorProto *local_a0;
  LocationRecorder location;
  LocationRecorder start_location;
  Token start_token;
  
  local_a8 = &message->reserved_range_;
  bVar2 = true;
  local_b8 = this;
  local_b0 = parent_location;
  local_a0 = message;
  do {
    LocationRecorder::LocationRecorder
              (&location,local_b0,
               (local_a0->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    pDVar3 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Add(local_a8);
    start_token.text._M_dataplus._M_p = (pointer)&start_token.text.field_2;
    start_token.text._M_string_length = 0;
    start_token.text.field_2._M_local_buf[0] = '\0';
    LocationRecorder::LocationRecorder(&start_location,&location,1);
    this_00 = local_b8;
    io::Tokenizer::Token::operator=(&start_token,&local_b8->input_->current_);
    error = "Expected field number range.";
    if (bVar2) {
      error = "Expected field name or number range.";
    }
    bVar1 = ConsumeInteger(this_00,&start,error);
    LocationRecorder::~LocationRecorder(&start_location);
    if (bVar1) {
      bVar1 = TryConsume(this_00,"to");
      if (bVar1) {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        bVar1 = TryConsume(this_00,"max");
        iVar5 = -2;
        if ((!bVar1) &&
           (bVar1 = ConsumeInteger(this_00,&local_c0,"Expected integer."), iVar5 = local_c0, !bVar1)
           ) {
          LocationRecorder::~LocationRecorder(&start_location);
          goto LAB_00352537;
        }
        LocationRecorder::~LocationRecorder(&start_location);
        iVar4 = start;
      }
      else {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        LocationRecorder::StartAt(&start_location,&start_token);
        LocationRecorder::EndAt(&start_location,&start_token);
        iVar4 = start;
        LocationRecorder::~LocationRecorder(&start_location);
        iVar5 = iVar4;
      }
      local_c0 = iVar5 + 1;
      pDVar3->start_ = iVar4;
      *(byte *)(pDVar3->_has_bits_).has_bits_ = (byte)(pDVar3->_has_bits_).has_bits_[0] | 3;
      pDVar3->end_ = local_c0;
      bVar1 = true;
      bVar2 = false;
      this_00 = local_b8;
    }
    else {
LAB_00352537:
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&start_token.text);
    LocationRecorder::~LocationRecorder(&location);
    if (!bVar1) {
      return false;
    }
    bVar1 = TryConsume(this_00,",");
    if (!bVar1) {
      bVar2 = ConsumeEndOfDeclaration(local_b8,";",local_b0);
      return bVar2;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNumbers(DescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    DescriptorProto::ReservedRange* range = message->add_reserved_range();
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, DescriptorProto::ReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, (first ? "Expected field name or number range."
                                       : "Expected field number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}